

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::compute::anon_unknown_0::SSBOBarrierTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SSBOBarrierTestInstance *this)

{
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  TestStatus *__return_storage_ptr___00;
  deUint32 queueFamilyIndex;
  uint uVar2;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *pDVar3;
  DescriptorPoolBuilder *pDVar4;
  DescriptorSetUpdateBuilder *pDVar5;
  ProgramBinary *pPVar6;
  ulong uVar7;
  ostream *poVar8;
  RefBase<vk::VkCommandBuffer_s_*> local_4b8;
  VkDeviceSize local_490;
  VkBufferMemoryBarrier writeUniformConstantsBarrier;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_448;
  TestStatus *local_428;
  VkQueue local_420;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_418;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_3f8;
  VkDescriptorBufferInfo uniformBufferDescriptorInfo;
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  VkDescriptorBufferInfo workBufferDescriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_388;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_368;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_348;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_328;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_308;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_2e8;
  string local_2c8;
  Buffer outputBuffer;
  Buffer uniformBuffer;
  ostringstream msg;
  Buffer workBuffer;
  VkBufferMemoryBarrier betweenShadersBarrier;
  VkBufferMemoryBarrier afterComputeBarrier;
  
  local_428 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_420 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  uVar2 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_workSize);
  local_490 = (long)(int)uVar2 << 2;
  makeBufferCreateInfo((VkBufferCreateInfo *)&msg,local_490,0x20);
  compute::Buffer::Buffer
            (&workBuffer,vk,device,allocator,(VkBufferCreateInfo *)&msg,(MemoryRequirement)0x0);
  makeBufferCreateInfo((VkBufferCreateInfo *)&msg,4,0x20);
  compute::Buffer::Buffer
            (&outputBuffer,vk,device,allocator,(VkBufferCreateInfo *)&msg,(MemoryRequirement)0x1);
  *(undefined4 *)
   (outputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr)->m_hostPtr = 0;
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  makeBufferCreateInfo((VkBufferCreateInfo *)&msg,4,0x10);
  compute::Buffer::Buffer
            (&uniformBuffer,vk,device,allocator,(VkBufferCreateInfo *)&msg,(MemoryRequirement)0x1);
  *(undefined4 *)
   (uniformBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
    .m_data.ptr)->m_hostPtr = 0x7f;
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((uniformBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (uniformBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&msg);
  pDVar3 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     ((DescriptorSetLayoutBuilder *)&msg,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar3 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar3,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar3 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar3,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&writeUniformConstantsBarrier,pDVar3,vk,device
             ,0);
  local_3f8.m_data.deleter.m_device = (VkDevice)writeUniformConstantsBarrier._16_8_;
  local_3f8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)writeUniformConstantsBarrier._24_8_;
  local_3f8.m_data.object.m_internal = writeUniformConstantsBarrier._0_8_;
  local_3f8.m_data.deleter.m_deviceIface = (DeviceInterface *)writeUniformConstantsBarrier.pNext;
  writeUniformConstantsBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  writeUniformConstantsBarrier._4_4_ = 0;
  writeUniformConstantsBarrier.pNext = (void *)0x0;
  writeUniformConstantsBarrier.srcAccessMask = 0;
  writeUniformConstantsBarrier.dstAccessMask = 0;
  writeUniformConstantsBarrier.srcQueueFamilyIndex = 0;
  writeUniformConstantsBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&writeUniformConstantsBarrier);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&msg);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&writeUniformConstantsBarrier);
  pDVar4 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&writeUniformConstantsBarrier,
                      VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  pDVar4 = ::vk::DescriptorPoolBuilder::addType(pDVar4,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&msg,pDVar4,vk,device,1,1);
  local_2e8.m_data.object.m_internal = (deUint64)_msg;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&msg);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&writeUniformConstantsBarrier);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&msg,vk,device,
                    (VkDescriptorPool)local_2e8.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_3f8.m_data.object.m_internal);
  local_448.m_data.deleter.m_device = (VkDevice)0x0;
  local_448.m_data.deleter.m_pool.m_internal = 0;
  local_448.m_data.object.m_internal = (deUint64)_msg;
  local_448.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&msg);
  workBufferDescriptorInfo.buffer.m_internal =
       workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  workBufferDescriptorInfo.offset = 0;
  outputBufferDescriptorInfo.buffer.m_internal =
       outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  outputBufferDescriptorInfo.offset = 0;
  workBufferDescriptorInfo.range = local_490;
  outputBufferDescriptorInfo.range = 4;
  uniformBufferDescriptorInfo.buffer.m_internal =
       uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  uniformBufferDescriptorInfo.offset = 0;
  uniformBufferDescriptorInfo.range = 4;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&msg);
  writeUniformConstantsBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  writeUniformConstantsBarrier._4_4_ = 0;
  pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     ((DescriptorSetUpdateBuilder *)&msg,
                      (VkDescriptorSet)local_448.m_data.object.m_internal,
                      (Location *)&writeUniformConstantsBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                      &outputBufferDescriptorInfo);
  betweenShadersBarrier.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  betweenShadersBarrier._4_4_ = 0;
  pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar5,(VkDescriptorSet)local_448.m_data.object.m_internal,
                      (Location *)&betweenShadersBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                      &workBufferDescriptorInfo);
  afterComputeBarrier.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  afterComputeBarrier._4_4_ = 0;
  pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar5,(VkDescriptorSet)local_448.m_data.object.m_internal,
                      (Location *)&afterComputeBarrier,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                      &uniformBufferDescriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar5,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&msg);
  pPVar1 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&writeUniformConstantsBarrier,"comp0",
             (allocator<char> *)&betweenShadersBarrier);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar1,(string *)&writeUniformConstantsBarrier);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&msg,vk,device,pPVar6,0);
  local_308.m_data.deleter.m_device = (VkDevice)0x0;
  local_308.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_308.m_data.object.m_internal = (deUint64)_msg;
  local_308.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&msg);
  std::__cxx11::string::~string((string *)&writeUniformConstantsBarrier);
  pPVar1 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&writeUniformConstantsBarrier,"comp1",
             (allocator<char> *)&betweenShadersBarrier);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar1,(string *)&writeUniformConstantsBarrier);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&msg,vk,device,pPVar6,0);
  local_328.m_data.deleter.m_device = (VkDevice)0x0;
  local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_328.m_data.object.m_internal = (deUint64)_msg;
  local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&msg);
  std::__cxx11::string::~string((string *)&writeUniformConstantsBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&msg,vk,device,
                     (VkDescriptorSetLayout)local_3f8.m_data.object.m_internal);
  local_418.m_data.deleter.m_device = (VkDevice)0x0;
  local_418.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_418.m_data.object.m_internal = (deUint64)_msg;
  local_418.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&msg);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&msg,vk,device,
                      (VkPipelineLayout)local_418.m_data.object.m_internal,
                      (VkShaderModule)local_308.m_data.object.m_internal);
  local_348.m_data.deleter.m_device = (VkDevice)0x0;
  local_348.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_348.m_data.object.m_internal = (deUint64)_msg;
  local_348.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&msg);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&msg,vk,device,
                      (VkPipelineLayout)local_418.m_data.object.m_internal,
                      (VkShaderModule)local_328.m_data.object.m_internal);
  local_368.m_data.deleter.m_device = (VkDevice)0x0;
  local_368.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_368.m_data.object.m_internal = (deUint64)_msg;
  local_368.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&msg);
  makeBufferMemoryBarrier
            (&writeUniformConstantsBarrier,0x4000,8,
             (VkBuffer)
             uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,4);
  makeBufferMemoryBarrier
            (&betweenShadersBarrier,0x40,0x20,
             (VkBuffer)
             workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,local_490);
  makeBufferMemoryBarrier
            (&afterComputeBarrier,0x40,0x2000,
             (VkBuffer)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,4);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&msg,vk,device,queueFamilyIndex);
  local_388.m_data.deleter.m_device = (VkDevice)0x0;
  local_388.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_388.m_data.object.m_internal = (deUint64)_msg;
  local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&msg);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&msg,vk,device,
             (VkCommandPool)local_388.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_4b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_4b8.m_data.deleter.m_pool.m_internal = 0;
  local_4b8.m_data.object = (VkCommandBuffer_s *)_msg;
  local_4b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&msg);
  beginCommandBuffer(vk,local_4b8.m_data.object);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_4b8.m_data.object,1,local_348.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_4b8.m_data.object,1,local_418.m_data.object.m_internal,0,1,&local_448,0,0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_4b8.m_data.object,0x4000,1,0,0,0,1,&writeUniformConstantsBarrier,0,0);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,local_4b8.m_data.object,(ulong)(uint)(this->m_workSize).m_data[0],
             (ulong)(uint)(this->m_workSize).m_data[1],(ulong)(uint)(this->m_workSize).m_data[2]);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_4b8.m_data.object,0x800,0x800,0,0,0,1,&betweenShadersBarrier,0,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_4b8.m_data.object,1,local_368.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,local_4b8.m_data.object,(ulong)(uint)(this->m_workSize).m_data[0],
             (ulong)(uint)(this->m_workSize).m_data[1],(ulong)(uint)(this->m_workSize).m_data[2]);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_4b8.m_data.object,0x800,0x4000,0,0,0,1,&afterComputeBarrier,0,0);
  endCommandBuffer(vk,local_4b8.m_data.object);
  submitCommandsAndWait(vk,device,local_420,local_4b8.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  __return_storage_ptr___00 = local_428;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  if (*(outputBuffer.m_allocation.
        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->m_hostPtr
      == (int)uVar7 * 0x7f + (int)(((int)uVar7 - 1) * uVar7 >> 1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"Compute succeeded",(allocator<char> *)&local_2c8);
    tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar8 = std::operator<<((ostream *)&msg,"ERROR: comparison failed, expected ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,", got ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__cxx11::stringbuf::str();
    tcu::TestStatus::fail(__return_storage_ptr___00,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_4b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_388);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_368);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_348);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_418);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_328);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_308);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_448);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_2e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_3f8);
  compute::Buffer::~Buffer(&uniformBuffer);
  compute::Buffer::~Buffer(&outputBuffer);
  compute::Buffer::~Buffer(&workBuffer);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus SSBOBarrierTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create a work buffer used by both shaders

	const int workGroupCount = multiplyComponents(m_workSize);
	const VkDeviceSize workBufferSizeBytes = sizeof(deUint32) * workGroupCount;
	const Buffer workBuffer(vk, device, allocator, makeBufferCreateInfo(workBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::Any);

	// Create an output buffer

	const VkDeviceSize outputBufferSizeBytes = sizeof(deUint32);
	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(outputBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Initialize atomic counter value to zero
	{
		const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
		deUint32* outputBufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
		*outputBufferPtr = 0;
		flushMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);
	}

	// Create a uniform buffer (to pass uniform constants)

	const VkDeviceSize uniformBufferSizeBytes = sizeof(deUint32);
	const Buffer uniformBuffer(vk, device, allocator, makeBufferCreateInfo(uniformBufferSizeBytes, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Set the constants in the uniform buffer

	const deUint32	baseValue = 127;
	{
		const Allocation& uniformBufferAllocation = uniformBuffer.getAllocation();
		deUint32* uniformBufferPtr = static_cast<deUint32*>(uniformBufferAllocation.getHostPtr());
		uniformBufferPtr[0] = baseValue;

		flushMappedMemoryRange(vk, device, uniformBufferAllocation.getMemory(), uniformBufferAllocation.getOffset(), uniformBufferSizeBytes);
	}

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u)
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo workBufferDescriptorInfo = makeDescriptorBufferInfo(*workBuffer, 0ull, workBufferSizeBytes);
	const VkDescriptorBufferInfo outputBufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, outputBufferSizeBytes);
	const VkDescriptorBufferInfo uniformBufferDescriptorInfo = makeDescriptorBufferInfo(*uniformBuffer, 0ull, uniformBufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &outputBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &workBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(2u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &uniformBufferDescriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule0(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp0"), 0));
	const Unique<VkShaderModule> shaderModule1(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp1"), 0));

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline0(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule0));
	const Unique<VkPipeline> pipeline1(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule1));

	const VkBufferMemoryBarrier writeUniformConstantsBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_UNIFORM_READ_BIT, *uniformBuffer, 0ull, uniformBufferSizeBytes);

	const VkBufferMemoryBarrier betweenShadersBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *workBuffer, 0ull, workBufferSizeBytes);

	const VkBufferMemoryBarrier afterComputeBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, outputBufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline0);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &writeUniformConstantsBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &betweenShadersBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	// Switch to the second shader program
	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline1);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &afterComputeBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32	res = *bufferPtr;
	deUint32		ref = 0;

	for (int ndx = 0; ndx < workGroupCount; ++ndx)
		ref += baseValue + ndx;

	if (res != ref)
	{
		std::ostringstream msg;
		msg << "ERROR: comparison failed, expected " << ref << ", got " << res;
		return tcu::TestStatus::fail(msg.str());
	}
	return tcu::TestStatus::pass("Compute succeeded");
}